

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O2

void jmp_patchval(FuncState *fs,BCPos list,BCPos vtarget,BCReg reg,BCPos dtarget)

{
  int iVar1;
  long lVar2;
  BCPos dest;
  BCPos pc;
  ulong uVar3;
  
  uVar3 = (ulong)list;
  while (pc = (BCPos)uVar3, pc != 0xffffffff) {
    lVar2 = (ulong)*(ushort *)((long)&fs->bcbase[uVar3].ins + 2) - 0x8000;
    uVar3 = (ulong)(pc + 1 + (int)lVar2);
    if (lVar2 == -1) {
      uVar3 = 0xffffffff;
    }
    iVar1 = jmp_patchtestreg(fs,pc,reg);
    dest = vtarget;
    if (iVar1 == 0) {
      dest = dtarget;
    }
    jmp_patchins(fs,pc,dest);
  }
  return;
}

Assistant:

static void jmp_patchval(FuncState *fs, BCPos list, BCPos vtarget,
			 BCReg reg, BCPos dtarget)
{
  while (list != NO_JMP) {
    BCPos next = jmp_next(fs, list);
    if (jmp_patchtestreg(fs, list, reg))
      jmp_patchins(fs, list, vtarget);  /* Jump to target with value. */
    else
      jmp_patchins(fs, list, dtarget);  /* Jump to default target. */
    list = next;
  }
}